

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::set_level(logger *this,level_enum log_level)

{
  level_enum log_level_local;
  logger *this_local;
  memory_order __b;
  
  CLI::std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->level_).super___atomic_base<int>._M_i = log_level;
  UNLOCK();
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_level(level::level_enum log_level)
{
    level_.store(log_level);
}